

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3TableAffinity(Vdbe *v,Table *pTab,int iReg)

{
  uint n;
  VdbeOp *pVVar1;
  sqlite3 *db;
  size_t sVar2;
  VdbeOp *pPrev;
  char *zColAff;
  int i;
  int iReg_local;
  Table *pTab_local;
  Vdbe *v_local;
  
  if ((pTab->tabFlags & 0x10000) == 0) {
    pPrev = (VdbeOp *)pTab->zColAff;
    if (pPrev == (VdbeOp *)0x0) {
      pPrev = (VdbeOp *)sqlite3TableAffinityStr((sqlite3 *)0x0,pTab);
      if (pPrev == (VdbeOp *)0x0) {
        db = sqlite3VdbeDb(v);
        sqlite3OomFault(db);
        return;
      }
      pTab->zColAff = (char *)pPrev;
    }
    sVar2 = strlen((char *)pPrev);
    n = (uint)sVar2 & 0x3fffffff;
    if ((sVar2 & 0x3fffffff) != 0) {
      if (iReg == 0) {
        sqlite3VdbeChangeP4(v,-1,(char *)pPrev,n);
      }
      else {
        sqlite3VdbeAddOp4(v,0x60,iReg,n,0,(char *)pPrev,n);
      }
    }
  }
  else if (iReg == 0) {
    sqlite3VdbeAppendP4(v,pTab,-5);
    pVVar1 = sqlite3VdbeGetLastOp(v);
    pVVar1->opcode = '_';
    sqlite3VdbeAddOp3(v,0x61,pVVar1->p1,pVVar1->p2,pVVar1->p3);
  }
  else {
    sqlite3VdbeAddOp2(v,0x5f,iReg,(int)pTab->nNVCol);
    sqlite3VdbeAppendP4(v,pTab,-5);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableAffinity(Vdbe *v, Table *pTab, int iReg){
  int i;
  char *zColAff;
  if( pTab->tabFlags & TF_Strict ){
    if( iReg==0 ){
      /* Move the previous opcode (which should be OP_MakeRecord) forward
      ** by one slot and insert a new OP_TypeCheck where the current
      ** OP_MakeRecord is found */
      VdbeOp *pPrev;
      sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
      pPrev = sqlite3VdbeGetLastOp(v);
      assert( pPrev!=0 );
      assert( pPrev->opcode==OP_MakeRecord || sqlite3VdbeDb(v)->mallocFailed );
      pPrev->opcode = OP_TypeCheck;
      sqlite3VdbeAddOp3(v, OP_MakeRecord, pPrev->p1, pPrev->p2, pPrev->p3);
    }else{
      /* Insert an isolated OP_Typecheck */
      sqlite3VdbeAddOp2(v, OP_TypeCheck, iReg, pTab->nNVCol);
      sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
    }
    return;
  }
  zColAff = pTab->zColAff;
  if( zColAff==0 ){
    zColAff = sqlite3TableAffinityStr(0, pTab);
    if( !zColAff ){
      sqlite3OomFault(sqlite3VdbeDb(v));
      return;
    }
    pTab->zColAff = zColAff;
  }
  assert( zColAff!=0 );
  i = sqlite3Strlen30NN(zColAff);
  if( i ){
    if( iReg ){
      sqlite3VdbeAddOp4(v, OP_Affinity, iReg, i, 0, zColAff, i);
    }else{
      assert( sqlite3VdbeGetLastOp(v)->opcode==OP_MakeRecord
              || sqlite3VdbeDb(v)->mallocFailed );
      sqlite3VdbeChangeP4(v, -1, zColAff, i);
    }
  }
}